

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcoll.c
# Opt level: O3

int ffgcx(fitsfile *fptr,int colnum,LONGLONG frow,LONGLONG fbit,LONGLONG nbit,char *larray,
         int *status)

{
  FITSfile *pFVar1;
  fitsfile *fptr_00;
  int iVar2;
  LONGLONG *pLVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  long offset;
  byte local_69;
  fitsfile *local_68;
  uint local_5c;
  ulong local_58;
  long local_50;
  long local_48;
  tcolumn *local_40;
  long local_38;
  
  if (nbit < 1 || 0 < *status) {
    return *status;
  }
  if (frow < 1) {
    *status = 0x133;
    return 0x133;
  }
  if (fbit < 1) {
    *status = 0x134;
LAB_0015acdd:
    iVar2 = 0x134;
  }
  else {
    local_68 = fptr;
    if (fptr->HDUposition == fptr->Fptr->curhdu) {
      if ((fptr->Fptr->datastart == -1) && (iVar2 = ffrdef(fptr,status), 0 < iVar2)) {
        return *status;
      }
    }
    else {
      ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
    }
    pFVar1 = local_68->Fptr;
    local_5c = pFVar1->tableptr[(long)colnum + -1].tdatatype;
    uVar4 = -local_5c;
    if (0 < (int)local_5c) {
      uVar4 = local_5c;
    }
    if (0xb < uVar4) {
      *status = 0x136;
      return 0x136;
    }
    uVar6 = fbit + 7U >> 3;
    local_50 = frow + -1;
    local_40 = pFVar1->tableptr + colnum;
    if ((int)local_5c < 1) {
      local_58 = uVar6;
      ffgdes(local_68,colnum,frow,&local_48,&local_38,status);
      if (local_5c == 0xffffffff) {
        lVar5 = local_48 + 0xe;
        if (-1 < local_48 + 7) {
          lVar5 = local_48 + 7;
        }
        local_48 = lVar5 >> 3;
      }
      if (local_48 < (long)(nbit + fbit + 6U >> 3)) goto LAB_0015accf;
      local_38 = local_38 + local_68->Fptr->datastart;
      pLVar3 = &local_68->Fptr->heapstart;
      uVar6 = local_58;
    }
    else {
      local_48 = local_40[-1].trepeat;
      if (local_5c == 1) {
        lVar5 = local_48 + 0xe;
        if (-1 < local_48 + 7) {
          lVar5 = local_48 + 7;
        }
        local_48 = lVar5 >> 3;
      }
      if (local_48 < (long)uVar6) {
LAB_0015accf:
        *status = 0x134;
        goto LAB_0015acdd;
      }
      local_38 = pFVar1->rowlength * local_50 + pFVar1->datastart;
      pLVar3 = &local_40[-1].tbcol;
    }
    fptr_00 = local_68;
    iVar2 = ffmbyt(local_68,local_38 + *pLVar3 + (uVar6 - 1),0,status);
    if (iVar2 < 1) {
      local_58 = uVar6 - 1;
      iVar2 = ffgbyt(fptr_00,1,&local_69,status);
      if (iVar2 < 1) {
        uVar6 = (ulong)((uint)(fbit + 7U) & 7);
        lVar5 = 0;
joined_r0x0015ad67:
        do {
          if (lVar5 < nbit) {
            larray[lVar5] = (ffgcx::onbit[uVar6] & local_69) != 0;
            lVar5 = lVar5 + 1;
            if (uVar6 < 7) {
              uVar6 = uVar6 + 1;
              goto joined_r0x0015ad67;
            }
          }
          if (lVar5 == nbit) break;
          uVar6 = local_58;
          if ((0 < (int)local_5c) && (uVar6 = local_58 + 1, local_58 + 1 == local_48)) {
            local_50 = local_50 + 1;
            ffmbyt(local_68,local_68->Fptr->rowlength * local_50 + local_68->Fptr->datastart +
                            local_40[-1].tbcol,0,status);
            local_58 = 0;
            uVar6 = local_58;
          }
          local_58 = uVar6;
          iVar2 = ffgbyt(local_68,1,&local_69,status);
          uVar6 = 0;
        } while (iVar2 < 1);
      }
      iVar2 = *status;
    }
    else {
      iVar2 = *status;
    }
  }
  return iVar2;
}

Assistant:

int ffgcx(  fitsfile *fptr,  /* I - FITS file pointer                       */
            int   colnum,    /* I - number of column to write (1 = 1st col) */
            LONGLONG  frow,      /* I - first row to write (1 = 1st row)        */
            LONGLONG  fbit,      /* I - first bit to write (1 = 1st)            */
            LONGLONG  nbit,      /* I - number of bits to write                 */
            char *larray,    /* O - array of logicals corresponding to bits */
            int  *status)    /* IO - error status                           */
/*
  read an array of logical values from a specified bit or byte
  column of the binary table.    larray is set = TRUE, if the corresponding
  bit = 1, otherwise it is set to FALSE.
  The binary table column being read from must have datatype 'B' or 'X'. 
*/
{
    LONGLONG bstart;
    long offset, ndone, ii, repeat, bitloc, fbyte;
    LONGLONG  rstart, estart;
    int tcode, descrp;
    unsigned char cbuff;
    static unsigned char onbit[8] = {128,  64,  32,  16,   8,   4,   2,   1};
    tcolumn *colptr;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    /*  check input parameters */
    if (nbit < 1)
        return(*status);
    else if (frow < 1)
        return(*status = BAD_ROW_NUM);
    else if (fbit < 1)
        return(*status = BAD_ELEM_NUM);

    /* position to the correct HDU */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    /* rescan header if data structure is undefined */
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               
            return(*status);

    fbyte = (long) ((fbit + 7) / 8);
    bitloc = (long) (fbit - 1 - ((fbit - 1) / 8 * 8));
    ndone = 0;
    rstart = frow - 1;
    estart = fbyte - 1;

    colptr  = (fptr->Fptr)->tableptr;   /* point to first column */
    colptr += (colnum - 1);     /* offset to correct column structure */

    tcode = colptr->tdatatype;

    if (abs(tcode) > TBYTE)
        return(*status = NOT_LOGICAL_COL); /* not correct datatype column */

    if (tcode > 0)
    {
        descrp = FALSE;  /* not a variable length descriptor column */
        /* N.B: REPEAT is the number of bytes, not number of bits */
        repeat = (long) colptr->trepeat;

        if (tcode == TBIT)
            repeat = (repeat + 7) / 8;  /* convert from bits to bytes */

        if (fbyte > repeat)
            return(*status = BAD_ELEM_NUM);

        /* calc the i/o pointer location to start of sequence of pixels */
        bstart = (fptr->Fptr)->datastart + ((fptr->Fptr)->rowlength * rstart) +
               colptr->tbcol + estart;
    }
    else
    {
        descrp = TRUE;  /* a variable length descriptor column */
        /* only bit arrays (tform = 'X') are supported for variable */
        /* length arrays.  REPEAT is the number of BITS in the array. */

        ffgdes(fptr, colnum, frow, &repeat, &offset, status);

        if (tcode == -TBIT)
            repeat = (repeat + 7) / 8;

        if ((fbit + nbit + 6) / 8 > repeat)
            return(*status = BAD_ELEM_NUM);

        /* calc the i/o pointer location to start of sequence of pixels */
        bstart = (fptr->Fptr)->datastart + offset + (fptr->Fptr)->heapstart + estart;
    }

    /* move the i/o pointer to the start of the pixel sequence */
    if (ffmbyt(fptr, bstart, REPORT_EOF, status) > 0)
        return(*status);

    /* read the next byte */
    while (1)
    {
      if (ffgbyt(fptr, 1, &cbuff, status) > 0)
        return(*status);

      for (ii = bitloc; (ii < 8) && (ndone < nbit); ii++, ndone++)
      {
        if(cbuff & onbit[ii])       /* test if bit is set */
          larray[ndone] = TRUE;
        else
          larray[ndone] = FALSE;
      }

      if (ndone == nbit)   /* finished all the bits */
        return(*status);

      /* not done, so get the next byte */
      if (!descrp)
      {
        estart++;
        if (estart == repeat) 
        {
          /* move the i/o pointer to the next row of pixels */
          estart = 0;
          rstart = rstart + 1;
          bstart = (fptr->Fptr)->datastart + ((fptr->Fptr)->rowlength * rstart) +
               colptr->tbcol;

          ffmbyt(fptr, bstart, REPORT_EOF, status);
        }
      }
      bitloc = 0;
    }
}